

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O1

void __thiscall TxRequestTracker::Impl::ReceivedResponse(Impl *this,NodeId peer,uint256 *txhash)

{
  type *this_00;
  iterator it;
  long in_FS_OFFSET;
  tuple<long,_bool,_const_uint256_&> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->m_index).super_type;
  local_40.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
  super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Head_base<1UL,_bool,_false>._M_head_impl =
       false;
  local_40.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
  super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Tuple_impl<2UL,_const_uint256_&>.
  super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl =
       (_Head_base<2UL,_const_uint256_&,_false>)(_Head_base<2UL,_const_uint256_&,_false>)txhash;
  local_40.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.super__Head_base<0UL,_long,_false>.
  _M_head_impl = peer;
  it = boost::multi_index::detail::
       ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
       ::find<std::tuple<long,bool,uint256_const&>>
                 ((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                   *)this_00,&local_40);
  if (it.node ==
      (this->m_index).
      super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
      .member) {
    local_40.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
    super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Head_base<1UL,_bool,_false>._M_head_impl =
         true;
    local_40.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.
    super__Tuple_impl<1UL,_bool,_const_uint256_&>.super__Tuple_impl<2UL,_const_uint256_&>.
    super__Head_base<2UL,_const_uint256_&,_false>._M_head_impl =
         (_Head_base<2UL,_const_uint256_&,_false>)(_Head_base<2UL,_const_uint256_&,_false>)txhash;
    local_40.super__Tuple_impl<0UL,_long,_bool,_const_uint256_&>.super__Head_base<0UL,_long,_false>.
    _M_head_impl = peer;
    it = boost::multi_index::detail::
         ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
         ::find<std::tuple<long,bool,uint256_const&>>
                   ((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                     *)this_00,&local_40);
  }
  if (it.node ==
      (this->m_index).
      super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
      .member) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    MakeCompleted(this,(Iter<ByTxHash>)it.node);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReceivedResponse(NodeId peer, const uint256& txhash)
    {
        // We need to search the ByPeer index for both (peer, false, txhash) and (peer, true, txhash).
        auto it = m_index.get<ByPeer>().find(ByPeerView{peer, false, txhash});
        if (it == m_index.get<ByPeer>().end()) {
            it = m_index.get<ByPeer>().find(ByPeerView{peer, true, txhash});
        }
        if (it != m_index.get<ByPeer>().end()) MakeCompleted(m_index.project<ByTxHash>(it));
    }